

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTests.cpp
# Opt level: O2

void __thiscall ParserTest_Unary_Test::TestBody(ParserTest_Unary_Test *this)

{
  _Head_base<0UL,_Node_*,_false> _Var1;
  _Alloc_hider _Var2;
  _Head_base<0UL,_Node_*,_false> local_d0;
  unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> local_c8;
  undefined1 local_bc [4];
  string local_b8;
  __uniq_ptr_impl<Node,_std::default_delete<Node>_> local_98;
  _Head_base<0UL,_Node_*,_false> local_90;
  _Head_base<0UL,_Node_*,_false> local_88;
  code *local_80 [2];
  code *local_70;
  code *local_68;
  code *local_60 [2];
  code *local_50;
  code *local_48;
  code *local_40 [2];
  code *local_30;
  code *local_28;
  
  local_c8._M_t.super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>.
  _M_t.super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>.
  super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl._0_4_ = 1;
  local_bc = (undefined1  [4])0x2;
  std::make_unique<NumericLiteralNode,int>((int *)&local_b8);
  std::
  make_unique<UnaryNode,UnaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((UnaryOperator *)&local_d0,&local_c8);
  if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"-2",(allocator<char> *)&local_c8);
  _Var1._M_head_impl = local_d0._M_head_impl;
  local_40[0] = Parser::parseUnary;
  local_40[1] = (code *)0x0;
  local_28 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_invoke;
  local_d0._M_head_impl = (Node *)0x0;
  local_30 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_manager;
  local_98._M_t.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
  super__Head_base<0UL,_Node_*,_false>._M_head_impl =
       (tuple<Node_*,_std::default_delete<Node>_>)
       (tuple<Node_*,_std::default_delete<Node>_>)_Var1._M_head_impl;
  setupTest(&local_b8,
            (function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)local_40,
            (unique_ptr<Node,_std::default_delete<Node>_> *)&local_98);
  if (_Var1._M_head_impl != (Node *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_Node[1])(_Var1._M_head_impl);
  }
  local_98._M_t.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
  super__Head_base<0UL,_Node_*,_false>._M_head_impl =
       (tuple<Node_*,_std::default_delete<Node>_>)
       (_Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>)0x0;
  std::_Function_base::~_Function_base((_Function_base *)local_40);
  std::__cxx11::string::~string((string *)&local_b8);
  local_bc = (undefined1  [4])0x1;
  std::make_unique<VariableNode,char_const(&)[2]>((char (*) [2])&local_c8);
  std::
  make_unique<UnaryNode,UnaryOperator,std::unique_ptr<VariableNode,std::default_delete<VariableNode>>>
            ((UnaryOperator *)&local_b8,
             (unique_ptr<VariableNode,_std::default_delete<VariableNode>_> *)local_bc);
  _Var2._M_p = local_b8._M_dataplus._M_p;
  _Var1._M_head_impl = local_d0._M_head_impl;
  local_b8._M_dataplus._M_p = (pointer)0x0;
  local_d0._M_head_impl = (Node *)_Var2._M_p;
  if (_Var1._M_head_impl != (Node *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_Node[1])();
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
  }
  local_b8._M_dataplus._M_p = (pointer)0x0;
  if ((long *)CONCAT44(local_c8._M_t.
                       super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>
                       .super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl._4_4_,
                       local_c8._M_t.
                       super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>
                       .super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl._0_4_) !=
      (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_c8._M_t.
                                   super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>
                                   .super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl.
                                   _4_4_,local_c8._M_t.
                                         super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>
                                         .super__Head_base<0UL,_NumericLiteralNode_*,_false>.
                                         _M_head_impl._0_4_) + 8))();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"-x",(allocator<char> *)&local_c8);
  _Var1._M_head_impl = local_d0._M_head_impl;
  local_60[0] = Parser::parseUnary;
  local_60[1] = (code *)0x0;
  local_d0._M_head_impl = (Node *)0x0;
  local_48 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_manager;
  local_88._M_head_impl = _Var1._M_head_impl;
  setupTest(&local_b8,
            (function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)local_60,
            (unique_ptr<Node,_std::default_delete<Node>_> *)&local_88);
  if (_Var1._M_head_impl != (Node *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_Node[1])(_Var1._M_head_impl);
  }
  std::_Function_base::~_Function_base((_Function_base *)local_60);
  std::__cxx11::string::~string((string *)&local_b8);
  local_bc = (undefined1  [4])0x0;
  std::make_unique<VariableNode,char_const(&)[2]>((char (*) [2])&local_c8);
  std::
  make_unique<UnaryNode,UnaryOperator,std::unique_ptr<VariableNode,std::default_delete<VariableNode>>>
            ((UnaryOperator *)&local_b8,
             (unique_ptr<VariableNode,_std::default_delete<VariableNode>_> *)local_bc);
  _Var2._M_p = local_b8._M_dataplus._M_p;
  _Var1._M_head_impl = local_d0._M_head_impl;
  local_b8._M_dataplus._M_p = (pointer)0x0;
  local_d0._M_head_impl = (Node *)_Var2._M_p;
  if (_Var1._M_head_impl != (Node *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_Node[1])();
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
  }
  local_b8._M_dataplus._M_p = (pointer)0x0;
  if ((long *)CONCAT44(local_c8._M_t.
                       super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>
                       .super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl._4_4_,
                       local_c8._M_t.
                       super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>
                       .super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl._0_4_) !=
      (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_c8._M_t.
                                   super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>
                                   .super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl.
                                   _4_4_,local_c8._M_t.
                                         super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>
                                         .super__Head_base<0UL,_NumericLiteralNode_*,_false>.
                                         _M_head_impl._0_4_) + 8))();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"~x",(allocator<char> *)&local_c8);
  _Var1._M_head_impl = local_d0._M_head_impl;
  local_80[0] = Parser::parseUnary;
  local_80[1] = (code *)0x0;
  local_d0._M_head_impl = (Node *)0x0;
  local_68 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_invoke;
  local_70 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_manager;
  local_90._M_head_impl = _Var1._M_head_impl;
  setupTest(&local_b8,
            (function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)local_80,
            (unique_ptr<Node,_std::default_delete<Node>_> *)&local_90);
  if (_Var1._M_head_impl != (Node *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_Node[1])(_Var1._M_head_impl);
  }
  std::_Function_base::~_Function_base((_Function_base *)local_80);
  std::__cxx11::string::~string((string *)&local_b8);
  if (local_d0._M_head_impl != (Node *)0x0) {
    (*(local_d0._M_head_impl)->_vptr_Node[1])();
  }
  return;
}

Assistant:

TEST(ParserTest, Unary)
{
  auto node = std::make_unique<UnaryNode>(UnaryOperator::Minus, std::make_unique<NumericLiteralNode>(2));
  setupTest("-2", &Parser::parseUnary, std::move(node));

  node = std::make_unique<UnaryNode>(UnaryOperator::Minus, std::make_unique<VariableNode>("x"));
  setupTest("-x", &Parser::parseUnary, std::move(node));

  node = std::make_unique<UnaryNode>(UnaryOperator::BinaryNegation, std::make_unique<VariableNode>("x"));
  setupTest("~x", &Parser::parseUnary, std::move(node));
}